

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

shared_ptr<tinygraph::Vertex> __thiscall
tinygraph::Graph::add(Graph *this,string *name,shared_ptr<tinygraph::Type> *type)

{
  undefined8 *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<tinygraph::Vertex> sVar1;
  __shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_28 = *in_RCX;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
  in_RCX[1] = 0;
  *in_RCX = 0;
  vertex_create((string *)this,type);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  std::__shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2> *)this);
  add_vertex((Graph *)name,(shared_ptr<tinygraph::Vertex> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tinygraph::Vertex>)
         sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Vertex> Graph::add(const std::string &name, std::shared_ptr<Type> type) {
        auto v = vertex_create(name, std::move(type));
        this->add_vertex(v);
        return v;
    }